

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::entry_point_arg_stage_in_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  char (*in_R9) [14];
  string local_a8 [32];
  spirv_cross local_88 [32];
  string local_68;
  SPIRType *local_48;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t stage_in_id;
  undefined1 local_19;
  CompilerMSL *local_18;
  CompilerMSL *this_local;
  string *decl;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = is_tesc_shader(this);
  if (((!bVar1) || (((this->msl_options).multi_patch_workgroup & 1U) == 0)) &&
     ((bVar1 = is_tese_shader(this), !bVar1 ||
      (((this->msl_options).raw_buffer_tese_input & 1U) == 0)))) {
    bVar1 = is_tese_shader(this);
    if (bVar1) {
      var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_in_var_id);
    }
    else {
      var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    }
    if (var._4_4_ != 0) {
      type = (SPIRType *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var._4_4_);
      local_48 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)type);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_88,this,local_48,0);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_a8,this,(ulong)uVar2,1);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[14]>
                (&local_68,local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4921b2,
                 (char (*) [2])local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " [[stage_in]]",in_R9);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string(local_a8);
      ::std::__cxx11::string::~string((string *)local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::entry_point_arg_stage_in()
{
	string decl;

	if ((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
	    (is_tese_shader() && msl_options.raw_buffer_tese_input))
		return decl;

	// Stage-in structure
	uint32_t stage_in_id;
	if (is_tese_shader())
		stage_in_id = patch_stage_in_var_id;
	else
		stage_in_id = stage_in_var_id;

	if (stage_in_id)
	{
		auto &var = get<SPIRVariable>(stage_in_id);
		auto &type = get_variable_data_type(var);

		add_resource_name(var.self);
		decl = join(type_to_glsl(type), " ", to_name(var.self), " [[stage_in]]");
	}

	return decl;
}